

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

bool __thiscall Highs::infeasibleBoundsOk(Highs *this)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  HighsInt iRow;
  HighsInt iCol;
  anon_class_32_4_0faf6aa2 assessInfeasibleBound;
  bool has_integrality;
  HighsInt num_ok_infeasible_bound;
  HighsInt num_true_infeasible_bound;
  HighsLp *lp;
  HighsLogOptions *log_options;
  allocator local_a9;
  string local_a8 [16];
  double *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff70;
  int local_88;
  HighsInt in_stack_ffffffffffffff7c;
  string *in_stack_ffffffffffffff80;
  anon_class_32_4_0faf6aa2 *in_stack_ffffffffffffff88;
  string local_70 [36];
  int local_4c;
  uint *local_40;
  HighsLogOptions *local_38;
  uint *local_30;
  byte local_21;
  uint local_20;
  uint local_1c;
  int *local_18;
  HighsLogOptions *local_10;
  
  local_10 = (HighsLogOptions *)(in_RDI + 0xe28);
  local_18 = (int *)(in_RDI + 0x138);
  local_1c = 0;
  local_20 = 0;
  sVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x2b0));
  local_21 = sVar2 != 0;
  local_40 = &local_20;
  local_38 = local_10;
  local_30 = &local_1c;
  for (local_4c = 0; local_4c < *local_18; local_4c = local_4c + 1) {
    if (((local_21 & 1) == 0) ||
       ((pvVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                             (local_18 + 0x5e),(long)local_4c), *pvVar3 != kSemiContinuous &&
        (pvVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                             (local_18 + 0x5e),(long)local_4c), *pvVar3 != kSemiInteger)))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_4c);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),(long)local_4c
                         );
      if (*pvVar4 <= dVar1 && dVar1 != *pvVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"Column",(allocator *)&stack0xffffffffffffff8f);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_4c);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),(long)local_4c);
        infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                  (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
      }
    }
  }
  for (local_88 = 0; local_88 < local_18[1]; local_88 = local_88 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),(long)local_88)
    ;
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),(long)local_88)
    ;
    if (*pvVar4 <= dVar1 && dVar1 != *pvVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Row",&local_a9);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),(long)local_88);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),(long)local_88);
      infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
  }
  if (0 < (int)local_20) {
    highsLogUser(local_10,kInfo,"Model has %d small inconsistent bound(s): rectified\n",
                 (ulong)local_20);
  }
  if (0 < (int)local_1c) {
    highsLogUser(local_10,kInfo,"Model has %d significant inconsistent bound(s): infeasible\n",
                 (ulong)local_1c);
  }
  return local_1c == 0;
}

Assistant:

bool Highs::infeasibleBoundsOk() {
  const HighsLogOptions& log_options = this->options_.log_options;
  HighsLp& lp = this->model_.lp_;

  HighsInt num_true_infeasible_bound = 0;
  HighsInt num_ok_infeasible_bound = 0;
  const bool has_integrality = lp.integrality_.size() > 0;
  // Lambda for assessing infeasible bounds
  auto assessInfeasibleBound = [&](const std::string type, const HighsInt iX,
                                   double& lower, double& upper) {
    double range = upper - lower;
    if (range >= 0) return true;
    if (range > -this->options_.primal_feasibility_tolerance) {
      num_ok_infeasible_bound++;
      bool report = num_ok_infeasible_bound <= 10;
      bool integer_lower = lower == std::floor(lower + 0.5);
      bool integer_upper = upper == std::floor(upper + 0.5);
      assert(!integer_lower || !integer_upper);
      if (integer_lower) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "upper bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, lower);
        upper = lower;
      } else if (integer_upper) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "lower bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, upper);
        lower = upper;
      } else {
        double mid = 0.5 * (lower + upper);
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "both bounds to %g\n",
                       type.c_str(), int(iX), lower, upper, range, mid);
        lower = mid;
        upper = mid;
      }
      return true;
    }
    num_true_infeasible_bound++;
    if (num_true_infeasible_bound <= 10)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "%s %d bounds [%g, %g] have excessive infeasibility = %g\n",
                   type.c_str(), int(iX), lower, upper, range);
    return false;
  };

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (has_integrality) {
      // Semi-variables can have inconsistent bounds
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
          lp.integrality_[iCol] == HighsVarType::kSemiInteger)
        continue;
    }
    if (lp.col_lower_[iCol] > lp.col_upper_[iCol])
      assessInfeasibleBound("Column", iCol, lp.col_lower_[iCol],
                            lp.col_upper_[iCol]);
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lp.row_lower_[iRow] > lp.row_upper_[iRow])
      assessInfeasibleBound("Row", iRow, lp.row_lower_[iRow],
                            lp.row_upper_[iRow]);
  }
  if (num_ok_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d small inconsistent bound(s): rectified\n",
                 int(num_ok_infeasible_bound));
  if (num_true_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d significant inconsistent bound(s): infeasible\n",
                 int(num_true_infeasible_bound));
  return num_true_infeasible_bound == 0;
}